

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * __thiscall
CTape::produce_letter_abi_cxx11_(string *__return_storage_ptr__,CTape *this,char letter)

{
  pointer pCVar1;
  CTape *pCVar2;
  string *__rhs;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  mapped_type *pmVar7;
  int iVar8;
  size_type *psVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  size_type i;
  ulong uVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Db_00;
  long *local_a8;
  ulong local_a0;
  long local_98 [2];
  CNumber<30> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  CTape *local_78;
  l2t_t *local_70;
  string *local_68;
  int local_60;
  uint local_5c;
  string local_58;
  int local_38;
  char local_31 [8];
  char letter_local;
  
  local_a8 = local_98;
  local_78 = this;
  local_31[0] = letter;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"producing letter ","");
  plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_a8,local_a0,0,'\x01');
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    uVar14 = (undefined4)*psVar9;
    uVar15 = *(undefined4 *)((long)plVar6 + 0x14);
    local_58.field_2._M_allocated_capacity = *psVar9;
    local_58.field_2._8_4_ = (undefined4)plVar6[3];
    local_58.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar9;
    uVar14 = extraout_XMM0_Da;
    uVar15 = extraout_XMM0_Db;
    local_58._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_58._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  debug::log((double)CONCAT44(uVar15,uVar14));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_88 = &local_78->m_pos;
  local_70 = &local_78->m_l2t;
  local_38 = -1;
  iVar11 = 0x39;
  lVar10 = 0;
  uVar13 = 0;
  local_68 = __return_storage_ptr__;
  do {
    pCVar2 = local_78;
    iVar12 = (int)uVar13;
    uVar3 = iVar12 % 0x1e + 0x1e;
    if ((uint)(iVar12 % 0x1e) < 0xffffffe2) {
      uVar3 = iVar12 % 0x1e;
    }
    local_58._M_dataplus._M_p._0_4_ = uVar3;
    uVar3 = CNumber<30>::shortest(local_88,(type *)&local_58);
    pCVar1 = (pCVar2->m_tape).super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>._M_impl
             .super__Vector_impl_data._M_start;
    pmVar7 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](local_70,local_31);
    uVar4 = *pmVar7 % 0x1b;
    local_58._M_dataplus._M_p._0_4_ = uVar4 + 0x1b;
    if (uVar4 < 0xffffffe5) {
      local_58._M_dataplus._M_p._0_4_ = uVar4;
    }
    iVar5 = CNumber<27>::shortest
                      ((CNumber<27> *)((long)&pCVar1->m_number + lVar10),(type *)&local_58);
    pCVar2 = local_78;
    uVar4 = -uVar3;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    iVar8 = -iVar5;
    if (0 < iVar5) {
      iVar8 = iVar5;
    }
    iVar8 = iVar8 + uVar4;
    if (iVar8 < iVar11) {
      iVar11 = iVar8;
      local_60 = iVar5;
      local_5c = uVar3;
      local_38 = iVar12;
    }
    uVar13 = uVar13 + 1;
    lVar10 = lVar10 + 4;
  } while (uVar13 < (ulong)((long)(local_78->m_tape).
                                  super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_78->m_tape).
                                  super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2));
  get_algorithm_abi_cxx11_(&local_58,(CTape *)(ulong)local_5c,local_60,iVar8);
  __rhs = local_68;
  std::__cxx11::string::operator=((string *)local_68,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pmVar7 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
           operator[](local_70,local_31);
  uVar4 = *pmVar7 % 0x1b;
  uVar3 = uVar4 + 0x1b;
  if (uVar4 < 0xffffffe5) {
    uVar3 = uVar4;
  }
  (pCVar2->m_tape).super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>._M_impl.
  super__Vector_impl_data._M_start[local_38].m_number = uVar3;
  uVar3 = local_38 % 0x1e + 0x1e;
  if ((uint)(local_38 % 0x1e) < 0xffffffe2) {
    uVar3 = local_38 % 0x1e;
  }
  (pCVar2->m_pos).m_number = uVar3;
  std::operator+(&local_58,"produced result: ",__rhs);
  debug::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __rhs;
}

Assistant:

std::string produce_letter(const char letter)
        {
            debug::log(std::string("producing letter ") + letter);
            std::string result;
            int min_pos = -1;
            int min_dist = TAPE_LENGTH + LETTERS_COUNT;  // Above in any way
            int min_move, min_change;
            for (tape_t::size_type i = 0; i < m_tape.size(); ++i)
            {
                int dist_move = m_pos.shortest(i);
                int dist_change = m_tape[i].shortest(m_l2t[letter]);
                int dist_res = std::abs(dist_move) + std::abs(dist_change);
                if (min_dist > dist_res)
                {
                    min_dist = dist_res;
                    min_move = dist_move;
                    min_change = dist_change;
                    min_pos = i;
                }
            }

            if (-1 == min_pos)
            {
                assert("broken logic");
            }

            result = get_algorithm(min_move, min_change);
            m_tape[min_pos] = m_l2t[letter];    // change tape
            m_pos = min_pos;                    // move pointer
            debug::log("produced result: " + result);
            return result;
        }